

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall S2Polygon::IsValid(S2Polygon *this)

{
  bool bVar1;
  S2LogMessage local_50;
  S2Error error;
  
  error.code_ = OK;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  bVar1 = FindValidationError(this,&error);
  if ((bVar1) && (FLAGS_s2debug == true)) {
    S2LogMessage::S2LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0xb4,kError,(ostream *)&std::cerr);
    ::operator<<(local_50.stream_,&error);
    S2LogMessage::~S2LogMessage(&local_50);
  }
  std::__cxx11::string::~string((string *)&error.text_);
  return !bVar1;
}

Assistant:

S2Polygon::S2Polygon(unique_ptr<S2Loop> loop, S2Debug override)
    : s2debug_override_(override) {
  Init(std::move(loop));
}